

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::Lambda_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::eval_internal
          (Lambda_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,Dispatch_State *t_ss)

{
  const_reference pvVar1;
  pointer pAVar2;
  type t_node;
  Dispatch_Engine *__uref;
  size_t in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar3;
  int local_11c;
  anon_class_104_5_1c3e7cb6_for_m_f_conflict local_118;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_b0;
  reference_wrapper<chaiscript::detail::Dispatch_Engine> local_a0;
  reference_wrapper<chaiscript::detail::Dispatch_Engine> engine;
  undefined1 local_88 [8];
  Param_Types param_types;
  size_type numparams;
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  captures;
  Dispatch_State *t_ss_local;
  Lambda_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this_local;
  
  numparams = (size_type)t_ss;
  captures._M_t._M_impl.super__Rb_tree_header._M_node_count = in_RDX;
  const::{lambda()#1}::operator()[abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
              *)local_50,&numparams);
  pvVar1 = Catch::clara::std::
           vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
           ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                         *)&t_ss[2].m_conversions,1);
  pAVar2 = Catch::clara::std::
           unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
           ::operator->(pvVar1);
  param_types._24_8_ =
       Catch::clara::std::
       vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
       ::size(&pAVar2->children);
  pvVar1 = Catch::clara::std::
           vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
           ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                         *)&t_ss[2].m_conversions,1);
  t_node = Catch::clara::std::
           unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
           ::operator*(pvVar1);
  Arg_List_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::get_arg_types
            ((Param_Types *)local_88,t_node,
             (Dispatch_State *)captures._M_t._M_impl.super__Rb_tree_header._M_node_count);
  __uref = chaiscript::detail::Dispatch_State::operator*
                     ((Dispatch_State *)captures._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::reference_wrapper<chaiscript::detail::Dispatch_Engine>::
  reference_wrapper<chaiscript::detail::Dispatch_Engine&,void,chaiscript::detail::Dispatch_Engine*>
            (&local_a0,__uref);
  local_118.engine._M_data = local_a0._M_data;
  Catch::clara::std::
  shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>::shared_ptr
            (&local_118.lambda_node,
             (shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>
              *)&t_ss[4].m_stack_holder);
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_118.param_names,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&t_ss[3].m_stack_holder);
  Catch::clara::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::map(&local_118.captures,
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
         *)local_50);
  local_118.this_capture = (bool)(*(byte *)&t_ss[4].m_engine._M_data & 1);
  local_11c = param_types._24_4_;
  dispatch::
  make_dynamic_proxy_function<chaiscript::eval::Lambda_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::Function_Params_const&)_1_,int,std::shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>>const&,chaiscript::dispatch::Param_Types_const&>
            ((dispatch *)&local_b0,&local_118,&local_11c,
             (shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>
              *)&t_ss[4].m_stack_holder,(Param_Types *)local_88);
  Boxed_Value::Boxed_Value<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,void>
            ((Boxed_Value *)this,&local_b0,false);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_b0);
  const::{lambda(chaiscript::Function_Params_const&)#1}::~Function_Params
            ((_lambda_chaiscript__Function_Params_const___1_ *)&local_118);
  dispatch::Param_Types::~Param_Types((Param_Types *)local_88);
  Catch::clara::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
          *)local_50);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        const auto captures = [&]() -> std::map<std::string, Boxed_Value> {
          std::map<std::string, Boxed_Value> named_captures;
          for (const auto &capture : this->children[0]->children) {
            named_captures.insert(std::make_pair(capture->children[0]->text, capture->children[0]->eval(t_ss)));
          }
          return named_captures;
        }();

        const auto numparams = this->children[1]->children.size();
        const auto param_types = Arg_List_AST_Node<T>::get_arg_types(*this->children[1], t_ss);

        std::reference_wrapper<chaiscript::detail::Dispatch_Engine> engine(*t_ss);

        return Boxed_Value(dispatch::make_dynamic_proxy_function(
            [engine, lambda_node = this->m_lambda_node, param_names = this->m_param_names, captures, this_capture = this->m_this_capture](
                const Function_Params &t_params) {
              return detail::eval_function(engine, *lambda_node, param_names, t_params, &captures, this_capture);
            },
            static_cast<int>(numparams),
            m_lambda_node,
            param_types));
      }